

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O3

Specification * ExprEval::Operator::get_specification(string *symbol)

{
  Specification *pSVar1;
  pointer __s2;
  size_t __n;
  int iVar2;
  Specification *pSVar3;
  long lVar4;
  long lVar5;
  
  pSVar1 = (Specification *)*specification_table;
  if (specification_table[1] - (long)pSVar1 != 0) {
    lVar5 = specification_table[1] - (long)pSVar1 >> 7;
    __s2 = (symbol->_M_dataplus)._M_p;
    __n = symbol->_M_string_length;
    lVar5 = lVar5 + (ulong)(lVar5 == 0);
    lVar4 = 0;
    pSVar3 = pSVar1;
    do {
      if ((pSVar3->symbol)._M_string_length == __n) {
        if (__n == 0) {
          return pSVar1 + lVar4;
        }
        iVar2 = bcmp((pSVar3->symbol)._M_dataplus._M_p,__s2,__n);
        if (iVar2 == 0) {
          return pSVar3;
        }
      }
      lVar4 = lVar4 + 1;
      pSVar3 = pSVar3 + 1;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  return (Specification *)0x0;
}

Assistant:

Operator::Specification* get_specification(const std::string& symbol){
            auto table = specification_table;
            for(size_t i=0; i<table->size(); ++i){
                if(table->at(i).symbol == symbol) return &(table->at(i));
            }
            return nullptr;
        }